

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt.c
# Opt level: O0

BlowfishContext * bcrypt_setup(uchar *key,int keybytes,uchar *salt,int saltbytes)

{
  BlowfishContext *ctx_00;
  BlowfishContext *ctx;
  int i;
  int saltbytes_local;
  uchar *salt_local;
  int keybytes_local;
  uchar *key_local;
  
  ctx_00 = blowfish_make_context();
  blowfish_initkey(ctx_00);
  blowfish_expandkey(ctx_00,key,(short)keybytes,salt,(short)saltbytes);
  for (ctx._0_4_ = 0; (int)ctx < 0x40; ctx._0_4_ = (int)ctx + 1) {
    blowfish_expandkey(ctx_00,salt,(short)saltbytes,(void *)0x0,0);
    blowfish_expandkey(ctx_00,key,(short)keybytes,(void *)0x0,0);
  }
  return ctx_00;
}

Assistant:

BlowfishContext *bcrypt_setup(const unsigned char *key, int keybytes,
                              const unsigned char *salt, int saltbytes)
{
    int i;
    BlowfishContext *ctx;

    ctx = blowfish_make_context();
    blowfish_initkey(ctx);
    blowfish_expandkey(ctx, key, keybytes, salt, saltbytes);

    /* Original bcrypt replaces this fixed loop count with the
     * variable cost. OpenSSH instead iterates the whole thing more
     * than once if it wants extra rounds. */
    for (i = 0; i < 64; i++) {
        blowfish_expandkey(ctx, salt, saltbytes, NULL, 0);
        blowfish_expandkey(ctx, key, keybytes, NULL, 0);
    }

    return ctx;
}